

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ret1.cxx
# Opt level: O3

int main(int ac,char **av)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char **ppcVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  string logarg;
  string arg;
  string logfile;
  string exename;
  CommandLineArguments args;
  undefined1 *local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  string local_e0;
  char *local_c0;
  char *local_b8;
  char local_b0;
  undefined7 uStack_af;
  undefined8 local_a0;
  char *local_98;
  ulong local_90;
  long *local_88 [2];
  long local_78 [2];
  CommandLineArguments local_68;
  long *local_50 [2];
  long local_40 [2];
  
  cmsys::Encoding::CommandLineArguments::Main(&local_68,ac,av);
  uVar3 = cmsys::Encoding::CommandLineArguments::argc(&local_68);
  ppcVar4 = cmsys::Encoding::CommandLineArguments::argv(&local_68);
  std::__cxx11::string::string((string *)local_88,*ppcVar4,(allocator *)&local_100);
  local_100 = &local_f0;
  local_f8 = (char *)0x0;
  local_f0 = 0;
  lVar5 = std::__cxx11::string::find((char *)local_88,0x115004,0);
  if (lVar5 == -1) {
    lVar5 = std::__cxx11::string::find((char *)local_88,0x115019,0);
    if (lVar5 == -1) {
      bVar2 = false;
      lVar5 = std::__cxx11::string::find((char *)local_88,0x115020,0);
      if (lVar5 != -1) {
        bVar2 = true;
        std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x115023);
      }
      goto LAB_00109b18;
    }
    pcVar6 = "-log-file=";
  }
  else {
    pcVar6 = "--log-file=";
  }
  bVar2 = false;
  std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,(ulong)pcVar6);
LAB_00109b18:
  iVar7 = 1;
  if (local_f8 != (char *)0x0) {
    local_c0 = &local_b0;
    local_b8 = (char *)0x0;
    local_b0 = '\0';
    if (1 < (int)uVar3) {
      local_90 = (ulong)(uVar3 - 1);
      local_a0 = 0;
      uVar8 = 1;
      do {
        std::__cxx11::string::string((string *)&local_e0,ppcVar4[uVar8],(allocator *)local_50);
        lVar5 = std::__cxx11::string::find((char *)&local_e0,(ulong)local_100,0);
        bVar1 = true;
        if (lVar5 == 0) {
          if (bVar2) {
            if (local_90 == uVar8) {
              local_a0 = 1;
              bVar1 = false;
            }
            else {
              pcVar6 = ppcVar4[uVar8 + 1];
              local_98 = local_b8;
              strlen(pcVar6);
              std::__cxx11::string::_M_replace((ulong)&local_c0,0,local_98,(ulong)pcVar6);
            }
          }
          else {
            std::__cxx11::string::substr((ulong)local_50,(ulong)&local_e0);
            std::__cxx11::string::operator=((string *)&local_c0,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (!bVar1) {
          if (local_c0 != &local_b0) {
            operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
          }
          iVar7 = (int)local_a0;
          goto LAB_00109d91;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      if (local_b8 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_e0,local_c0,(allocator *)local_50);
        cmsys::SystemTools::Touch(&local_e0,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      }
      iVar7 = 1;
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
      }
    }
  }
LAB_00109d91:
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_68);
  return iVar7;
}

Assistant:

int
main(int ac, char **av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  int argc = args.argc();
  const char* const* argv = args.argv();

  std::string exename = argv[0];
  std::string logarg;
  bool nextarg = false;

  if (exename.find("valgrind") != exename.npos)
    logarg = "--log-file=";
  else if (exename.find("purify") != exename.npos)
#ifdef _WIN32
    logarg = "/SAVETEXTDATA=";
#else
    logarg = "-log-file=";
#endif
  else if (exename.find("BC") != exename.npos)
    {
    nextarg = true;
    logarg = "/X";
    }

  if (!logarg.empty()) {
    std::string logfile;
    for (int i = 1; i < argc; i++) {
      std::string arg = argv[i];
      if (arg.find(logarg) == 0)
        {
        if (nextarg)
          {
          if (i == argc - 1)
            return 1; // invalid command line
          logfile = argv[i + 1];
          }
        else
          {
          logfile = arg.substr(logarg.length());
          }
        // keep searching, it may be overridden later to provoke an error
        }
      }

    if (!logfile.empty())
      cmSystemTools::Touch(logfile.c_str(), true);
  }

  return RETVAL;
}